

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  TextAttributes local_a0;
  Text local_80;
  
  lVar1 = std::__cxx11::string::find((char *)_string,0x157287);
  lVar3 = lVar1 + 2;
  if (lVar1 == -1) {
    lVar3 = 0;
  }
  poVar2 = (this->super_StreamingReporterBase).stream;
  local_a0.width = 0x4f;
  local_a0.tabChar = '\t';
  local_a0.indent = lVar3 + indent;
  local_a0.initialIndent = indent;
  Tbc::Text::Text(&local_80,_string,&local_a0);
  poVar2 = Tbc::operator<<(poVar2,&local_80);
  std::operator<<(poVar2,"\n");
  Tbc::Text::~Text(&local_80);
  return;
}

Assistant:

void printHeaderString( std::string const& _string, std::size_t indent = 0 ) {
            std::size_t i = _string.find( ": " );
            if( i != std::string::npos )
                i+=2;
            else
                i = 0;
            stream << Text( _string, TextAttributes()
                                        .setIndent( indent+i)
                                        .setInitialIndent( indent ) ) << "\n";
        }